

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3ColumnSetColl(sqlite3 *db,Column *pCol,char *zColl)

{
  int iVar1;
  char *pcVar2;
  char *zNew;
  i64 n;
  i64 nColl;
  char *zColl_local;
  Column *pCol_local;
  sqlite3 *db_local;
  
  iVar1 = sqlite3Strlen30(pCol->zCnName);
  zNew = (char *)(long)(iVar1 + 1);
  if ((pCol->colFlags & 4) != 0) {
    iVar1 = sqlite3Strlen30(zNew + (long)pCol->zCnName);
    zNew = zNew + (iVar1 + 1);
  }
  iVar1 = sqlite3Strlen30(zColl);
  pcVar2 = (char *)sqlite3DbRealloc(db,pCol->zCnName,(u64)(zNew + (iVar1 + 1)));
  if (pcVar2 != (char *)0x0) {
    pCol->zCnName = pcVar2;
    memcpy(zNew + (long)pCol->zCnName,zColl,(long)(iVar1 + 1));
    pCol->colFlags = pCol->colFlags | 0x200;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ColumnSetColl(
  sqlite3 *db,
  Column *pCol,
  const char *zColl
){
  i64 nColl;
  i64 n;
  char *zNew;
  assert( zColl!=0 );
  n = sqlite3Strlen30(pCol->zCnName) + 1;
  if( pCol->colFlags & COLFLAG_HASTYPE ){
    n += sqlite3Strlen30(pCol->zCnName+n) + 1;
  }
  nColl = sqlite3Strlen30(zColl) + 1;
  zNew = sqlite3DbRealloc(db, pCol->zCnName, nColl+n);
  if( zNew ){
    pCol->zCnName = zNew;
    memcpy(pCol->zCnName + n, zColl, nColl);
    pCol->colFlags |= COLFLAG_HASCOLL;
  }
}